

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  BPMNode *leaves;
  ulong uVar1;
  BPMNode *pBVar2;
  BPMNode **ppBVar3;
  uint uVar4;
  uint uVar5;
  size_t __nmemb;
  ulong uVar6;
  BPMLists lists;
  BPMLists local_70;
  BPMNode **local_38;
  
  if ((ulong)(uint)(1 << ((byte)maxbitlen & 0x1f)) <= numcodes - 1) {
    return 0x50;
  }
  leaves = (BPMNode *)malloc(numcodes * 0x18);
  if (leaves == (BPMNode *)0x0) {
    return 0x53;
  }
  if (numcodes == 0) {
    __nmemb = 0;
  }
  else {
    uVar1 = 0;
    __nmemb = 0;
    do {
      if (frequencies[uVar1] != 0) {
        leaves[__nmemb].weight = frequencies[uVar1];
        leaves[__nmemb].index = (uint)uVar1;
        __nmemb = __nmemb + 1;
      }
      uVar1 = uVar1 + 1;
    } while ((uVar1 & 0xffffffff) != numcodes);
  }
  if (numcodes != 0) {
    uVar1 = 0;
    do {
      lengths[uVar1] = 0;
      uVar1 = uVar1 + 1;
    } while ((uVar1 & 0xffffffff) != numcodes);
  }
  if (__nmemb == 1) {
    uVar5 = leaves->index;
    lengths[uVar5] = 1;
    lengths[(ulong)uVar5 == 0] = 1;
  }
  else {
    if (__nmemb != 0) {
      qsort(leaves,__nmemb,0x18,bpmnode_compare);
      uVar4 = (maxbitlen + 1) * maxbitlen * 2;
      local_70.nextfree = 0;
      local_70.memsize = uVar4;
      local_70.numfree = uVar4;
      local_70.listsize = maxbitlen;
      pBVar2 = (BPMNode *)malloc((ulong)uVar4 * 0x18);
      local_70.memory = pBVar2;
      local_70.freelist = (BPMNode **)malloc((ulong)uVar4 * 8);
      local_38 = local_70.freelist;
      ppBVar3 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      local_70.chains0 = ppBVar3;
      local_70.chains1 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      uVar5 = 0x53;
      if (((ppBVar3 != (BPMNode **)0x0 && local_38 != (BPMNode **)0x0) && pBVar2 != (BPMNode *)0x0)
          && local_70.chains1 != (BPMNode **)0x0) {
        uVar5 = 0;
      }
      if (((ppBVar3 != (BPMNode **)0x0 && local_38 != (BPMNode **)0x0) && pBVar2 != (BPMNode *)0x0)
          && local_70.chains1 != (BPMNode **)0x0) {
        if (uVar4 != 0) {
          uVar1 = 0;
          do {
            local_70.freelist[uVar1] = local_70.memory + uVar1;
            uVar1 = uVar1 + 1;
          } while (uVar1 != uVar4);
        }
        bpmnode_create(&local_70,leaves->weight,1,(BPMNode *)0x0);
        bpmnode_create(&local_70,leaves[1].weight,2,(BPMNode *)0x0);
        if ((ulong)local_70.listsize != 0) {
          uVar1 = 0;
          do {
            local_70.chains0[uVar1] = local_70.memory;
            local_70.chains1[uVar1] = local_70.memory + 1;
            uVar1 = uVar1 + 1;
          } while (local_70.listsize != uVar1);
        }
        uVar1 = __nmemb * 2 - 2;
        if (uVar1 != 2) {
          uVar6 = 2;
          do {
            boundaryPM(&local_70,leaves,__nmemb,maxbitlen - 1,(int)uVar6);
            uVar6 = (ulong)((int)uVar6 + 1);
          } while (uVar1 != uVar6);
        }
        for (pBVar2 = local_70.chains1[maxbitlen - 1]; pBVar2 != (BPMNode *)0x0;
            pBVar2 = pBVar2->tail) {
          if (pBVar2->index != 0) {
            uVar1 = 0;
            do {
              lengths[leaves[uVar1].index] = lengths[leaves[uVar1].index] + 1;
              uVar4 = (int)uVar1 + 1;
              uVar1 = (ulong)uVar4;
            } while (uVar4 != pBVar2->index);
          }
        }
      }
      free(local_70.memory);
      free(local_70.freelist);
      free(local_70.chains0);
      free(local_70.chains1);
      goto LAB_001a5151;
    }
    lengths[0] = 1;
    lengths[1] = 1;
  }
  uVar5 = 0;
LAB_001a5151:
  free(leaves);
  return uVar5;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
                                      size_t numcodes, unsigned maxbitlen)
{
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if(numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if((1u << maxbitlen) < numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if(!leaves) return 83; /*alloc fail*/

  for(i = 0; i != numcodes; ++i)
  {
    if(frequencies[i] > 0)
    {
      leaves[numpresent].weight = frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  for(i = 0; i != numcodes; ++i) lengths[i] = 0;

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoritical 0 bits but in practice zlib wants 1 bit*/
  if(numpresent == 0)
  {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  }
  else if(numpresent == 1)
  {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  }
  else
  {
    BPMLists lists;
    BPMNode* node;

    qsort(leaves, numpresent, sizeof(BPMNode), bpmnode_compare);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if(!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if(!error)
    {
      for(i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for(i = 0; i != lists.listsize; ++i)
      {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for(i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, maxbitlen - 1, i);

      for(node = lists.chains1[maxbitlen - 1]; node; node = node->tail)
      {
        for(i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}